

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_tree(archive_write *a,isoent **isoentpp)

{
  iso9660_conflict *iso9660_00;
  isoent *isoent_00;
  isofile *piVar1;
  isofile *piVar2;
  int iVar3;
  mode_t mVar4;
  mode_t mVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 local_190 [8];
  archive_string as;
  isoent *vp;
  int l;
  char *p;
  char *fn;
  isofile *f2;
  isofile *f1;
  isoent *np;
  isoent *isoent;
  isoent *dent;
  iso9660_conflict *iso9660;
  char name [256];
  isoent **isoentpp_local;
  archive_write *a_local;
  
  iso9660_00 = (iso9660_conflict *)a->format_data;
  isoent_00 = *isoentpp;
  isoent = (iso9660_00->primary).rootent;
  if ((isoent_00->file->parentdir).length == 0) {
    p = "";
  }
  else {
    p = (isoent_00->file->parentdir).s;
  }
  pcVar7 = p;
  if (((iso9660_00->cur_dirstr).length == (isoent_00->file->parentdir).length) &&
     (iVar3 = strcmp((iso9660_00->cur_dirstr).s,p), iVar3 == 0)) {
    iVar3 = isoent_add_child_tail(iso9660_00->cur_dirent,isoent_00);
    if (iVar3 != 0) {
      return 0;
    }
    f1 = (isofile *)
         __archive_rb_tree_find_node(&iso9660_00->cur_dirent->rbtree,(isoent_00->file->basename).s);
  }
  else {
    while (vp._4_4_ = get_path_component((char *)&iso9660,0x100,p), vp._4_4_ != 0) {
      if (vp._4_4_ < 0) {
        archive_set_error(&a->archive,-1,"A name buffer is too small");
        _isoent_free(isoent_00);
        return -0x1e;
      }
      f1 = (isofile *)isoent_find_child(isoent,(char *)&iso9660);
      if (((isoent *)f1 == (isoent *)0x0) || (*p == '\0')) goto LAB_008167eb;
      if (-1 < (char)(((isoent *)f1)->field_0xe8 << 6)) {
        pcVar7 = archive_entry_pathname(((isoent *)f1)->file->entry);
        pcVar6 = archive_entry_pathname(isoent_00->file->entry);
        archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar7,
                          pcVar6);
        _isoent_free(isoent_00);
        *isoentpp = (isoent *)0x0;
        return -0x19;
      }
      p = p + vp._4_4_;
      isoent = (isoent *)f1;
      if (*p == '/') {
        p = p + 1;
      }
    }
    f1 = (isofile *)0x0;
LAB_008167eb:
    if (f1 == (isofile *)0x0) {
      while (*p != '\0') {
        local_190 = (undefined1  [8])0x0;
        as.s = (char *)0x0;
        as.length = 0;
        archive_strncat((archive_string *)local_190,pcVar7,
                        (size_t)(p + ((long)vp._4_4_ - (long)pcVar7)));
        if (*(char *)((long)local_190 + (long)(as.s + -1)) == '/') {
          *(char *)((long)local_190 + (long)(as.s + -1)) = '\0';
          as.s = as.s + -1;
        }
        as.buffer_length = (size_t)isoent_create_virtual_dir(a,iso9660_00,(char *)local_190);
        if ((isoent *)as.buffer_length == (isoent *)0x0) {
          archive_string_free((archive_string *)local_190);
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          _isoent_free(isoent_00);
          *isoentpp = (isoent *)0x0;
          return -0x1e;
        }
        archive_string_free((archive_string *)local_190);
        if (iso9660_00->dircnt_max < *(int *)(*(long *)(as.buffer_length + 0x18) + 0x88)) {
          iso9660_00->dircnt_max = *(int *)(*(long *)(as.buffer_length + 0x18) + 0x88);
        }
        isoent_add_child_tail(isoent,(isoent *)as.buffer_length);
        isoent = (isoent *)as.buffer_length;
        p = p + vp._4_4_;
        if (*p == '/') {
          p = p + 1;
        }
        vp._4_4_ = get_path_component((char *)&iso9660,0x100,p);
        if (vp._4_4_ < 0) {
          archive_string_free((archive_string *)local_190);
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          _isoent_free(isoent_00);
          *isoentpp = (isoent *)0x0;
          return -0x1e;
        }
      }
      iso9660_00->cur_dirent = isoent;
      (iso9660_00->cur_dirstr).length = 0;
      archive_string_ensure
                (&iso9660_00->cur_dirstr,
                 (isoent->file->parentdir).length + (isoent->file->basename).length + 2);
      if ((isoent->file->parentdir).length + (isoent->file->basename).length == 0) {
        *(iso9660_00->cur_dirstr).s = '\0';
      }
      else {
        if ((isoent->file->parentdir).length != 0) {
          (iso9660_00->cur_dirstr).length = 0;
          archive_string_concat(&iso9660_00->cur_dirstr,&isoent->file->parentdir);
          archive_strappend_char(&iso9660_00->cur_dirstr,'/');
        }
        archive_string_concat(&iso9660_00->cur_dirstr,&isoent->file->basename);
      }
      iVar3 = isoent_add_child_tail(isoent,isoent_00);
      if (iVar3 != 0) {
        return 0;
      }
      f1 = (isofile *)__archive_rb_tree_find_node(&isoent->rbtree,(isoent_00->file->basename).s);
    }
  }
  piVar1 = f1->hardlink_target;
  piVar2 = isoent_00->file;
  mVar4 = archive_entry_filetype(piVar1->entry);
  mVar5 = archive_entry_filetype(piVar2->entry);
  if (mVar4 == mVar5) {
    f1->hardlink_target = piVar2;
    isoent_00->file = piVar1;
    *(byte *)&f1[1].entry = *(byte *)&f1[1].entry & 0xfe;
    _isoent_free(isoent_00);
    *isoentpp = (isoent *)f1;
    a_local._4_4_ = 0;
  }
  else {
    pcVar7 = archive_entry_pathname(piVar1->entry);
    archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                      pcVar7);
    _isoent_free(isoent_00);
    *isoentpp = (isoent *)0x0;
    a_local._4_4_ = -0x19;
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_tree(struct archive_write *a, struct isoent **isoentpp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *dent, *isoent, *np;
	struct isofile *f1, *f2;
	const char *fn, *p;
	int l;

	isoent = *isoentpp;
	dent = iso9660->primary.rootent;
	if (isoent->file->parentdir.length > 0)
		fn = p = isoent->file->parentdir.s;
	else
		fn = p = "";

	/*
	 * If the path of the parent directory of `isoent' entry is
	 * the same as the path of `cur_dirent', add isoent to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(iso9660->cur_dirstr))
	      == archive_strlen(&(isoent->file->parentdir)) &&
	    strcmp(iso9660->cur_dirstr.s, fn) == 0) {
		if (!isoent_add_child_tail(iso9660->cur_dirent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(iso9660->cur_dirent->rbtree),
			    isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			_isoent_free(isoent);
			return (ARCHIVE_FATAL);
		}

		np = isoent_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next subdirectory. */
		if (!np->dir) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    archive_entry_pathname(np->file->entry),
			    archive_entry_pathname(isoent->file->entry));
			_isoent_free(isoent);
			*isoentpp = NULL;
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct isoent *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			vp = isoent_create_virtual_dir(a, iso9660, as.s);
			if (vp == NULL) {
				archive_string_free(&as);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			archive_string_free(&as);

			if (vp->file->dircnt > iso9660->dircnt_max)
				iso9660->dircnt_max = vp->file->dircnt;
			isoent_add_child_tail(dent, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where isoent can be
		 * inserted. */
		iso9660->cur_dirent = dent;
		archive_string_empty(&(iso9660->cur_dirstr));
		archive_string_ensure(&(iso9660->cur_dirstr),
		    archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) + 2);
		if (archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) == 0)
			iso9660->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->file->parentdir)) > 0) {
				archive_string_copy(&(iso9660->cur_dirstr),
				    &(dent->file->parentdir));
				archive_strappend_char(&(iso9660->cur_dirstr), '/');
			}
			archive_string_concat(&(iso9660->cur_dirstr),
			    &(dent->file->basename));
		}

		if (!isoent_add_child_tail(dent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(dent->rbtree), isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	f1 = np->file;
	f2 = isoent->file;

	/* If the file type of entries is different,
	 * we cannot handle it. */
	if (archive_entry_filetype(f1->entry) !=
	    archive_entry_filetype(f2->entry)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    archive_entry_pathname(f1->entry));
		_isoent_free(isoent);
		*isoentpp = NULL;
		return (ARCHIVE_FAILED);
	}

	/* Swap file entries. */
	np->file = f2;
	isoent->file = f1;
	np->virtual = 0;

	_isoent_free(isoent);
	*isoentpp = np;
	return (ARCHIVE_OK);
}